

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpressionInMacro_abi_cxx11_(AssertionResult *this)

{
  StringRef rhs;
  StringRef rhs_00;
  bool bVar1;
  StringRef *in_RSI;
  string *in_RDI;
  string *expr;
  string *psVar2;
  StringRef *in_stack_ffffffffffffffd8;
  
  psVar2 = in_RDI;
  bVar1 = StringRef::empty(in_RSI);
  if (bVar1) {
    StringRef::operator_cast_to_string(in_stack_ffffffffffffffd8);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    StringRef::size(in_RSI);
    StringRef::size(in_RSI + 2);
    std::__cxx11::string::reserve((ulong)in_RDI);
    rhs.m_size = (size_type)in_RSI;
    rhs.m_start = (char *)psVar2;
    operator+=(in_RDI,rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,"( ");
    rhs_00.m_size = (size_type)in_RSI;
    rhs_00.m_start = (char *)psVar2;
    operator+=(in_RDI,rhs_00);
    std::__cxx11::string::operator+=((string *)in_RDI," )");
  }
  return psVar2;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        if ( m_info.macroName.empty() ) {
            return static_cast<std::string>( m_info.capturedExpression );
        }
        std::string expr;
        expr.reserve( m_info.macroName.size() + m_info.capturedExpression.size() + 4 );
        expr += m_info.macroName;
        expr += "( ";
        expr += m_info.capturedExpression;
        expr += " )";
        return expr;
    }